

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInternalFormatQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::NumSampleCountsBufferCase::iterate
          (NumSampleCountsBufferCase *this)

{
  ostringstream *poVar1;
  GLint GVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint buffer [2];
  MessageBuilder local_1a0;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  buffer[0] = -0x7b;
  buffer[1] = -0x7b;
  local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying GL_NUM_SAMPLE_COUNTS to larger-than-needed buffer.");
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar5 + 0x880))(0x9100,0x8058,0x9380,2,buffer);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"get GL_NUM_SAMPLE_COUNTS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                  ,0xe9);
  GVar2 = buffer[1];
  if (buffer[1] != -0x7b) {
    local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"ERROR: trailing values were modified.");
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  buffer[0] = -0x7b;
  local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying GL_NUM_SAMPLE_COUNTS to zero-sized buffer.");
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar5 + 0x880))(0x9100,0x8058,0x9380,0,buffer);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"get GL_NUM_SAMPLE_COUNTS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                  ,0xf8);
  if (buffer[0] == -0x7b) {
    if (GVar2 == -0x7b) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_004c5cda;
    }
  }
  else {
    local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"ERROR: Query wrote over buffer bounds.");
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Unexpected buffer modification";
  testResult = QP_TEST_RESULT_FAIL;
LAB_004c5cda:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

NumSampleCountsBufferCase::IterateResult NumSampleCountsBufferCase::iterate (void)
{
	const glw::GLint		defaultValue	= -123; // queries always return positive values
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	bool					error			= false;

	// Query to larger buffer
	{
		glw::GLint buffer[2] = { defaultValue, defaultValue };

		m_testCtx.getLog() << tcu::TestLog::Message << "Querying GL_NUM_SAMPLE_COUNTS to larger-than-needed buffer." << tcu::TestLog::EndMessage;
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 2, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_NUM_SAMPLE_COUNTS");

		if (buffer[1] != defaultValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: trailing values were modified." << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	// Query to empty buffer
	{
		glw::GLint buffer[1] = { defaultValue };

		m_testCtx.getLog() << tcu::TestLog::Message << "Querying GL_NUM_SAMPLE_COUNTS to zero-sized buffer." << tcu::TestLog::EndMessage;
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 0, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_NUM_SAMPLE_COUNTS");

		if (buffer[0] != defaultValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Query wrote over buffer bounds." << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	// Result
	if (!error)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected buffer modification");

	return STOP;
}